

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O0

void testOptimized(string *tempDir)

{
  ostream *poVar1;
  exception *e;
  string *in_stack_00000088;
  Compression in_stack_00000090;
  bool in_stack_00000096;
  bool in_stack_00000097;
  string *in_stack_ffffffffffffffc0;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\nTesting optimized code path for rgb(a) images-- 2048x1152 (alignment respected) UNCOMPRESSED"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tNON-OPTIMIZABLE file");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_1c5214::testNonOptimized(in_stack_ffffffffffffffc0);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tALIGNED -- MONO -- NO COMPRESSION");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_1c5214::testAllCombinations
            (in_stack_00000097,in_stack_00000096,in_stack_00000090,in_stack_00000088);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tUNALIGNED -- MONO -- NO COMPRESSION");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_1c5214::testAllCombinations
            (in_stack_00000097,in_stack_00000096,in_stack_00000090,in_stack_00000088);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tALIGNED -- MONO -- ZIP COMPRESSION");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_1c5214::testAllCombinations
            (in_stack_00000097,in_stack_00000096,in_stack_00000090,in_stack_00000088);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tUNALIGNED -- MONO -- ZIP COMPRESSION");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_1c5214::testAllCombinations
            (in_stack_00000097,in_stack_00000096,in_stack_00000090,in_stack_00000088);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tALIGNED -- STEREO -- NO COMPRESSION");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_1c5214::testAllCombinations
            (in_stack_00000097,in_stack_00000096,in_stack_00000090,in_stack_00000088);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tUNALIGNED -- STEREO -- NO COMPRESSION");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_1c5214::testAllCombinations
            (in_stack_00000097,in_stack_00000096,in_stack_00000090,in_stack_00000088);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tALIGNED -- STEREO -- ZIP COMPRESSION");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_1c5214::testAllCombinations
            (in_stack_00000097,in_stack_00000096,in_stack_00000090,in_stack_00000088);
  poVar1 = std::operator<<((ostream *)&std::cout,"\tUNALIGNED -- STEREO -- ZIP COMPRESSION");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_1c5214::testAllCombinations
            (in_stack_00000097,in_stack_00000096,in_stack_00000090,in_stack_00000088);
  poVar1 = std::operator<<((ostream *)&std::cout,"RGB(A) files validation complete \n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testOptimized (const std::string& tempDir)
{
    try
    {
        // Test all combinations
        // Aligned file with no compression
        // Unaligned file with no compression
        // Aligned file with zip compression
        // Unaligned file with zip compression
        //
        // Other algorithms are not necessary because we are not testing
        // compression but whetherthe optimized readPixels() code works
        // with a compressed file.
        // MONO
        cout << "\nTesting optimized code path for rgb(a) images-- "
                "2048x1152 (alignment respected) UNCOMPRESSED"
             << endl;

        cout << "\tNON-OPTIMIZABLE file" << endl;
        testNonOptimized (tempDir);

        cout << "\tALIGNED -- MONO -- NO COMPRESSION" << endl;
        testAllCombinations (true, false, NO_COMPRESSION, tempDir);

        cout << "\tUNALIGNED -- MONO -- NO COMPRESSION" << endl;
        testAllCombinations (false, false, NO_COMPRESSION, tempDir);

        cout << "\tALIGNED -- MONO -- ZIP COMPRESSION" << endl;
        testAllCombinations (true, false, ZIP_COMPRESSION, tempDir);

        cout << "\tUNALIGNED -- MONO -- ZIP COMPRESSION" << endl;
        testAllCombinations (false, false, ZIP_COMPRESSION, tempDir);

        //// STEREO
        cout << "\tALIGNED -- STEREO -- NO COMPRESSION" << endl;
        testAllCombinations (true, true, NO_COMPRESSION, tempDir);

        cout << "\tUNALIGNED -- STEREO -- NO COMPRESSION" << endl;
        testAllCombinations (false, true, NO_COMPRESSION, tempDir);

        cout << "\tALIGNED -- STEREO -- ZIP COMPRESSION" << endl;
        testAllCombinations (true, true, ZIP_COMPRESSION, tempDir);

        cout << "\tUNALIGNED -- STEREO -- ZIP COMPRESSION" << endl;
        testAllCombinations (false, true, ZIP_COMPRESSION, tempDir);

        cout << "RGB(A) files validation complete \n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}